

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
Validator_importInvalidComponentNotDirectlyDeterminedFromImport_Test::
~Validator_importInvalidComponentNotDirectlyDeterminedFromImport_Test
          (Validator_importInvalidComponentNotDirectlyDeterminedFromImport_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, importInvalidComponentNotDirectlyDeterminedFromImport)
{
    const std::string errorMessage1 =
        "Component 'invalid_component' does not have a valid 'id' attribute, '8ioisfje+'.";
    const std::string errorMessage2 =
        "Imported component 'imported_component' is not valid because:\n"
        "  -> Component 'imported_component' importing 'invalid_component' from 'component_that_is_invalid.cellml' has an error:\n"
        "   - Component 'invalid_component' does not have a valid 'id' attribute, '8ioisfje+'.";

    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();
    auto importer = libcellml::Importer::create();

    auto model = parser->parseModel(fileContents("importer/importing_a_component_that_is_invalid.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto invalidComponentModel = parser->parseModel(fileContents("importer/component_that_is_invalid.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->issueCount());

    validator->validateModel(invalidComponentModel);
    EXPECT_EQ(size_t(1), validator->issueCount());
    EXPECT_EQ(errorMessage1, validator->issue(0)->description());

    importer->resolveImports(model, resourcePath("importer/"));

    validator->validateModel(model);
    EXPECT_EQ(size_t(1), validator->errorCount());
    EXPECT_EQ(errorMessage2, validator->issue(0)->description());
}